

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logistic_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::logistic_dist<float>::operator()(logistic_dist<float> *this,lcg64_shift *r)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  
  uVar2 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar2;
  uVar2 = uVar2 >> 0x11 ^ uVar2;
  uVar2 = uVar2 << 0x1f ^ uVar2;
  fVar3 = (float)(uVar2 >> 1 ^ uVar2 >> 9) * 1.0842019e-19 + 1.1920929e-07;
  fVar1 = (this->P).eta_;
  fVar3 = logf((1.0 - fVar3) / fVar3);
  return fVar1 - fVar3 * (this->P).theta_;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformoo<result_type>(r));
    }